

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

int32 __thiscall google::protobuf::MapValueRef::GetInt32Value(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_INT32) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x255);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::GetInt32Value");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)0x61918c);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8));
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return *this->data_;
}

Assistant:

int32 GetInt32Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32,
               "MapValueRef::GetInt32Value");
    return *reinterpret_cast<int32*>(data_);
  }